

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

mg_server * mg_create_server(void *server_data,mg_handler_t handler)

{
  long lVar1;
  mg_server *s;
  char *pcVar2;
  long lVar3;
  
  s = (mg_server *)calloc(1,200);
  ns_mgr_init((ns_mgr *)s,server_data);
  if (static_config_options[0] != (char *)0x0) {
    lVar3 = 0;
    do {
      pcVar2 = *(char **)((long)static_config_options + lVar3 * 2 + 8);
      if (pcVar2 != (char *)0x0 && *(long *)((long)s->config_options + lVar3) == 0) {
        pcVar2 = mg_strdup(pcVar2);
        *(char **)((long)s->config_options + lVar3) = pcVar2;
      }
      lVar1 = lVar3 * 2;
      lVar3 = lVar3 + 8;
    } while (*(long *)((long)static_config_options + lVar1 + 0x10) != 0);
  }
  s->event_handler = handler;
  return s;
}

Assistant:

struct mg_server *mg_create_server(void *server_data, mg_handler_t handler) {
  struct mg_server *server = (struct mg_server *) calloc(1, sizeof(*server));
  ns_mgr_init(&server->ns_mgr, server_data);
  set_default_option_values(server->config_options);
  server->event_handler = handler;
  return server;
}